

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O1

void __thiscall
hwtest::pgraph::anon_unknown_14::MthdSurfSwzFormat::~MthdSurfSwzFormat(MthdSurfSwzFormat *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00348698;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

bool is_valid_val() override {
		int fmt = extr(val, 0, 16);
		if (fmt == 0 || fmt > (cls & 0xff00 ? 0xe : 0xd))
			return false;
		int swzx = extr(val, 16, 8);
		int swzy = extr(val, 24, 8);
		if (swzx > 0xb)
			return false;
		if (swzy > 0xb)
			return false;
		if (swzx == 0)
			return false;
		if (swzy == 0 && cls == 0x52)
			return false;
		return true;
	}